

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
operator[](GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *this,SizeType index)

{
  if ((this->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/document.h"
                  ,0x635,
                  "GenericValue<Encoding, Allocator> &rapidjson::GenericValue<rapidjson::UTF8<>>::operator[](SizeType) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  if (index < (this->data_).s.length) {
    return (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)((ulong)index * 0x10 + ((ulong)(this->data_).s.str & 0xffffffffffff));
  }
  __assert_fail("index < data_.a.size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/document.h"
                ,0x636,
                "GenericValue<Encoding, Allocator> &rapidjson::GenericValue<rapidjson::UTF8<>>::operator[](SizeType) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

GenericValue& operator[](SizeType index) {
        RAPIDJSON_ASSERT(IsArray());
        RAPIDJSON_ASSERT(index < data_.a.size);
        return GetElementsPointer()[index];
    }